

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O0

void __thiscall asmjit::Zone::reset(Zone *this,bool releaseMemory)

{
  void *pvVar1;
  long *plVar2;
  byte in_SIL;
  long *in_RDI;
  Block *prev;
  Block *next;
  Block *cur;
  long *local_28;
  
  local_28 = (long *)in_RDI[2];
  if (local_28 != (long *)Zone_zeroBlock) {
    if ((in_SIL & 1) == 0) {
      for (; *local_28 != 0; local_28 = (long *)*local_28) {
      }
      *in_RDI = (long)(local_28 + 3);
      in_RDI[1] = *in_RDI + local_28[2];
      in_RDI[2] = (long)local_28;
    }
    else {
      pvVar1 = (void *)local_28[1];
      plVar2 = local_28;
      do {
        local_28 = plVar2;
        plVar2 = (long *)*local_28;
        free(local_28);
        local_28 = (long *)pvVar1;
      } while (plVar2 != (long *)0x0);
      while (local_28 != (long *)0x0) {
        pvVar1 = *(void **)((long)local_28 + 8);
        free(local_28);
        local_28 = (long *)pvVar1;
      }
      *in_RDI = 0;
      in_RDI[1] = 0;
      in_RDI[2] = (long)Zone_zeroBlock;
    }
  }
  return;
}

Assistant:

void Zone::reset(bool releaseMemory) noexcept {
  Block* cur = _block;

  // Can't be altered.
  if (cur == &Zone_zeroBlock)
    return;

  if (releaseMemory) {
    // Since cur can be in the middle of the double-linked list, we have to
    // traverse to both directions `prev` and `next` separately.
    Block* next = cur->next;
    do {
      Block* prev = cur->prev;
      Internal::releaseMemory(cur);
      cur = prev;
    } while (cur);

    cur = next;
    while (cur) {
      next = cur->next;
      Internal::releaseMemory(cur);
      cur = next;
    }

    _ptr = nullptr;
    _end = nullptr;
    _block = const_cast<Zone::Block*>(&Zone_zeroBlock);
  }
  else {
    while (cur->prev)
      cur = cur->prev;

    _ptr = cur->data;
    _end = _ptr + cur->size;
    _block = cur;
  }
}